

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O1

void nn_xreq_rm(nn_sockbase *self,nn_pipe *pipe)

{
  int increment;
  nn_lb_data *data;
  
  data = (nn_lb_data *)nn_pipe_getdata(pipe);
  nn_lb_rm((nn_lb *)(self + 1),data);
  nn_fq_rm((nn_fq *)&self[0x19].sock,(nn_fq_data *)(data + 1));
  nn_free(data);
  increment = nn_lb_get_priority((nn_lb *)(self + 1));
  nn_sockbase_stat_increment(self,0x191,increment);
  return;
}

Assistant:

void nn_xreq_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;

    xreq = nn_cont (self, struct nn_xreq, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_lb_rm (&xreq->lb, &data->lb);
    nn_fq_rm (&xreq->fq, &data->fq);
    nn_free (data);

    nn_sockbase_stat_increment (self, NN_STAT_CURRENT_SND_PRIORITY,
        nn_lb_get_priority (&xreq->lb));
}